

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csafestring.c
# Opt level: O0

int safe_strncmp(csafestring_t *obj,char *str,size_t size)

{
  size_t sVar1;
  ulong in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  size_t strLength;
  size_t length;
  ulong local_28;
  int local_4;
  
  if (in_RSI == (char *)0x0) {
    local_4 = 1;
  }
  else {
    sVar1 = strlen(in_RSI);
    local_28 = in_RDX;
    if ((ulong)in_RDI[1] < in_RDX) {
      local_28 = in_RDI[1];
    }
    if (sVar1 < local_28) {
      local_28 = sVar1;
    }
    local_4 = strncmp((char *)*in_RDI,in_RSI,local_28);
  }
  return local_4;
}

Assistant:

int safe_strncmp(csafestring_t *obj, const char *str, size_t size) {

	size_t length = size;
	if ( str == NULL ) {
		return 1;
	}

	size_t strLength = strlen(str);

	if ( obj->buffer_length < length ) {
		length = obj->buffer_length;
	}

	if ( strLength < length ) {
		length = strLength;
	}

	return strncmp(obj->data, str, length);
}